

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::BVHNIntersector1<4,_16781328,_false,_embree::avx::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 (*pauVar13) [16];
  uint uVar14;
  AABBNodeMB4D *node1;
  ulong uVar15;
  ulong uVar16;
  RayQueryContext *extraout_RDX;
  undefined1 (*pauVar17) [16];
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  float fVar24;
  float fVar31;
  float fVar32;
  vint4 bi;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar33;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar34;
  float fVar41;
  float fVar42;
  vint4 bi_2;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar44;
  float fVar51;
  float fVar52;
  vint4 bi_1;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar53;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar54;
  vfloat4 a0;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  vint4 ai_3;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  vint4 ai;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  vint4 ai_1;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  float fVar85;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar86 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [16];
  float fVar93;
  undefined1 auVar94 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar95 [64];
  undefined1 auVar99 [16];
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10e8 [16];
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  RayHit *local_10c0;
  Intersectors *local_10b8;
  RayQueryContext *local_10b0;
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_10b0 = context;
  local_10b8 = This;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    aVar4 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar26 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
    auVar25 = vrsqrtss_avx(auVar26,auVar26);
    fVar54 = auVar25._0_4_;
    local_fb8[0] = fVar54 * 1.5 - auVar26._0_4_ * 0.5 * fVar54 * fVar54 * fVar54;
    local_1028 = (ray->super_RayK<1>).dir.field_0.m128[0];
    fStack_1024 = local_1028;
    fStack_1020 = local_1028;
    fStack_101c = local_1028;
    auVar45 = vshufps_avx(ZEXT416((uint)local_fb8[0]),ZEXT416((uint)local_fb8[0]),0);
    auVar55._0_4_ = aVar4.x * auVar45._0_4_;
    auVar55._4_4_ = aVar4.y * auVar45._4_4_;
    auVar55._8_4_ = aVar4.z * auVar45._8_4_;
    auVar55._12_4_ = aVar4.field_3.w * auVar45._12_4_;
    auVar25 = vshufpd_avx(auVar55,auVar55,1);
    auVar26 = vmovshdup_avx(auVar55);
    auVar79._8_4_ = 0x80000000;
    auVar79._0_8_ = 0x8000000080000000;
    auVar79._12_4_ = 0x80000000;
    auVar61._12_4_ = 0;
    auVar61._0_12_ = ZEXT812(0);
    auVar61 = auVar61 << 0x20;
    auVar75 = vunpckhps_avx(auVar55,auVar61);
    auVar21 = vshufps_avx(auVar75,ZEXT416(auVar26._0_4_ ^ 0x80000000),0x41);
    auVar75._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
    auVar75._8_8_ = auVar79._8_8_ ^ auVar25._8_8_;
    auVar75 = vinsertps_avx(auVar75,auVar55,0x2a);
    auVar26 = vdpps_avx(auVar21,auVar21,0x7f);
    auVar25 = vdpps_avx(auVar75,auVar75,0x7f);
    auVar26 = vcmpps_avx(auVar25,auVar26,1);
    auVar26 = vshufps_avx(auVar26,auVar26,0);
    auVar26 = vblendvps_avx(auVar75,auVar21,auVar26);
    auVar25 = vdpps_avx(auVar26,auVar26,0x7f);
    local_1038 = (ray->super_RayK<1>).dir.field_0.m128[1];
    fStack_1034 = local_1038;
    fStack_1030 = local_1038;
    fStack_102c = local_1038;
    auVar75 = vrsqrtss_avx(auVar25,auVar25);
    fVar54 = auVar75._0_4_;
    auVar25 = ZEXT416((uint)(fVar54 * 1.5 - auVar25._0_4_ * 0.5 * fVar54 * fVar54 * fVar54));
    auVar25 = vshufps_avx(auVar25,auVar25,0);
    auVar76._0_4_ = auVar25._0_4_ * auVar26._0_4_;
    auVar76._4_4_ = auVar25._4_4_ * auVar26._4_4_;
    auVar76._8_4_ = auVar25._8_4_ * auVar26._8_4_;
    auVar76._12_4_ = auVar25._12_4_ * auVar26._12_4_;
    auVar26 = vshufps_avx(auVar76,auVar76,0xc9);
    auVar25 = vshufps_avx(auVar55,auVar55,0xc9);
    auVar83._0_4_ = auVar25._0_4_ * auVar76._0_4_;
    auVar83._4_4_ = auVar25._4_4_ * auVar76._4_4_;
    auVar83._8_4_ = auVar25._8_4_ * auVar76._8_4_;
    auVar83._12_4_ = auVar25._12_4_ * auVar76._12_4_;
    auVar80._0_4_ = auVar26._0_4_ * auVar55._0_4_;
    auVar80._4_4_ = auVar26._4_4_ * auVar55._4_4_;
    auVar80._8_4_ = auVar26._8_4_ * auVar55._8_4_;
    auVar80._12_4_ = auVar26._12_4_ * auVar55._12_4_;
    auVar26 = vsubps_avx(auVar80,auVar83);
    auVar75 = vshufps_avx(auVar26,auVar26,0xc9);
    auVar26 = vdpps_avx(auVar75,auVar75,0x7f);
    local_1048 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fStack_1044 = local_1048;
    fStack_1040 = local_1048;
    fStack_103c = local_1048;
    auVar25 = vrsqrtss_avx(auVar26,auVar26);
    fVar54 = auVar25._0_4_;
    auVar26 = ZEXT416((uint)(fVar54 * 1.5 - auVar26._0_4_ * 0.5 * fVar54 * fVar54 * fVar54));
    auVar26 = vshufps_avx(auVar26,auVar26,0);
    auVar25._0_4_ = auVar75._0_4_ * auVar26._0_4_;
    auVar25._4_4_ = auVar75._4_4_ * auVar26._4_4_;
    auVar25._8_4_ = auVar75._8_4_ * auVar26._8_4_;
    auVar25._12_4_ = auVar75._12_4_ * auVar26._12_4_;
    auVar26._0_4_ = auVar45._0_4_ * auVar55._0_4_;
    auVar26._4_4_ = auVar45._4_4_ * auVar55._4_4_;
    auVar26._8_4_ = auVar45._8_4_ * auVar55._8_4_;
    auVar26._12_4_ = auVar45._12_4_ * auVar55._12_4_;
    auVar75 = vunpcklps_avx(auVar76,auVar26);
    auVar26 = vunpckhps_avx(auVar76,auVar26);
    auVar45 = vunpcklps_avx(auVar25,auVar61);
    auVar25 = vunpckhps_avx(auVar25,auVar61);
    local_f88 = vunpcklps_avx(auVar26,auVar25);
    local_fa8 = vunpcklps_avx(auVar75,auVar45);
    local_f98 = vunpckhps_avx(auVar75,auVar45);
    pauVar17 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    auVar25 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar75 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar45._8_4_ = 0x7fffffff;
    auVar45._0_8_ = 0x7fffffff7fffffff;
    auVar45._12_4_ = 0x7fffffff;
    auVar26 = vandps_avx((undefined1  [16])aVar4,auVar45);
    auVar62._8_4_ = 0x219392ef;
    auVar62._0_8_ = 0x219392ef219392ef;
    auVar62._12_4_ = 0x219392ef;
    auVar26 = vcmpps_avx(auVar26,auVar62,1);
    auVar26 = vblendvps_avx((undefined1  [16])aVar4,auVar62,auVar26);
    auVar45 = vrcpps_avx(auVar26);
    fVar54 = auVar45._0_4_;
    auVar21._0_4_ = auVar26._0_4_ * fVar54;
    fVar44 = auVar45._4_4_;
    auVar21._4_4_ = auVar26._4_4_ * fVar44;
    fVar34 = auVar45._8_4_;
    auVar21._8_4_ = auVar26._8_4_ * fVar34;
    fVar24 = auVar45._12_4_;
    auVar21._12_4_ = auVar26._12_4_ * fVar24;
    auVar63._8_4_ = 0x3f800000;
    auVar63._0_8_ = 0x3f8000003f800000;
    auVar63._12_4_ = 0x3f800000;
    auVar26 = vsubps_avx(auVar63,auVar21);
    auVar22._0_4_ = fVar54 + fVar54 * auVar26._0_4_;
    auVar22._4_4_ = fVar44 + fVar44 * auVar26._4_4_;
    auVar22._8_4_ = fVar34 + fVar34 * auVar26._8_4_;
    auVar22._12_4_ = fVar24 + fVar24 * auVar26._12_4_;
    uVar3 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_1058._4_4_ = uVar3;
    local_1058._0_4_ = uVar3;
    local_1058._8_4_ = uVar3;
    local_1058._12_4_ = uVar3;
    auVar86 = ZEXT1664(local_1058);
    uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_1068._4_4_ = uVar3;
    local_1068._0_4_ = uVar3;
    local_1068._8_4_ = uVar3;
    local_1068._12_4_ = uVar3;
    auVar95 = ZEXT1664(local_1068);
    fVar54 = (ray->super_RayK<1>).org.field_0.m128[2];
    auVar77._4_4_ = fVar54;
    auVar77._0_4_ = fVar54;
    auVar77._8_4_ = fVar54;
    auVar77._12_4_ = fVar54;
    local_1078 = vshufps_avx(auVar22,auVar22,0);
    auVar82 = ZEXT1664(local_1078);
    auVar26 = vmovshdup_avx(auVar22);
    local_1088 = vshufps_avx(auVar22,auVar22,0x55);
    auVar84 = ZEXT1664(local_1088);
    uVar20 = (ulong)(auVar22._0_4_ < 0.0) * 0x10;
    auVar45 = vshufpd_avx(auVar22,auVar22,1);
    local_1098 = vshufps_avx(auVar22,auVar22,0xaa);
    auVar90 = ZEXT1664(local_1098);
    uVar19 = (ulong)(auVar26._0_4_ < 0.0) << 4 | 0x20;
    uVar18 = (ulong)(auVar45._0_4_ < 0.0) << 4 | 0x40;
    local_10a8 = vshufps_avx(auVar25,auVar25,0);
    auVar91 = ZEXT1664(local_10a8);
    auVar26 = vshufps_avx(auVar75,auVar75,0);
    auVar23 = ZEXT1664(auVar26);
    local_10c0 = ray;
LAB_00b60730:
    if (pauVar17 != (undefined1 (*) [16])&local_f78) {
      pauVar13 = pauVar17 + -1;
      pauVar17 = pauVar17 + -1;
      if (*(float *)(*pauVar13 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar15 = *(ulong *)*pauVar17;
        while ((uVar15 & 8) == 0) {
          fVar44 = (ray->super_RayK<1>).dir.field_0.m128[3];
          uVar14 = (uint)uVar15 & 7;
          uVar16 = uVar15 & 0xfffffffffffffff0;
          if (uVar14 == 3) {
            local_ff8 = *(float *)(uVar16 + 0x20);
            fStack_ff4 = *(float *)(uVar16 + 0x24);
            fStack_ff0 = *(float *)(uVar16 + 0x28);
            fStack_fec = *(float *)(uVar16 + 0x2c);
            local_1008 = *(float *)(uVar16 + 0x60);
            fStack_1004 = *(float *)(uVar16 + 100);
            fStack_1000 = *(float *)(uVar16 + 0x68);
            fStack_ffc = *(float *)(uVar16 + 0x6c);
            local_fe8 = *(float *)(uVar16 + 0x70);
            fStack_fe4 = *(float *)(uVar16 + 0x74);
            fStack_fe0 = *(float *)(uVar16 + 0x78);
            fStack_fdc = *(float *)(uVar16 + 0x7c);
            auVar26 = vshufps_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),0);
            fVar41 = auVar26._0_4_;
            fVar31 = auVar26._4_4_;
            fVar52 = auVar26._8_4_;
            fVar42 = auVar26._12_4_;
            fVar44 = 1.0 - fVar44;
            auVar26 = vshufps_avx(ZEXT416((uint)(fVar44 * 0.0)),ZEXT416((uint)(fVar44 * 0.0)),0);
            local_10d8 = auVar26._0_4_;
            local_fd8 = local_10d8 + fVar41 * *(float *)(uVar16 + 0xe0);
            fStack_10d4 = auVar26._4_4_;
            fStack_fd4 = fStack_10d4 + fVar31 * *(float *)(uVar16 + 0xe4);
            fStack_10d0 = auVar26._8_4_;
            fStack_fd0 = fStack_10d0 + fVar52 * *(float *)(uVar16 + 0xe8);
            fStack_10cc = auVar26._12_4_;
            fStack_fcc = fStack_10cc + fVar42 * *(float *)(uVar16 + 0xec);
            local_fc8 = local_10d8 + fVar41 * *(float *)(uVar16 + 0xf0);
            fStack_fc4 = fStack_10d4 + fVar31 * *(float *)(uVar16 + 0xf4);
            fStack_fc0 = fStack_10d0 + fVar52 * *(float *)(uVar16 + 0xf8);
            fStack_fbc = fStack_10cc + fVar42 * *(float *)(uVar16 + 0xfc);
            local_10d8 = local_10d8 + fVar41 * *(float *)(uVar16 + 0x100);
            fStack_10d4 = fStack_10d4 + fVar31 * *(float *)(uVar16 + 0x104);
            fStack_10d0 = fStack_10d0 + fVar52 * *(float *)(uVar16 + 0x108);
            fStack_10cc = fStack_10cc + fVar42 * *(float *)(uVar16 + 0x10c);
            auVar37._0_4_ =
                 local_1028 * local_ff8 +
                 local_1038 * *(float *)(uVar16 + 0x50) + *(float *)(uVar16 + 0x80) * local_1048;
            auVar37._4_4_ =
                 fStack_1024 * fStack_ff4 +
                 fStack_1034 * *(float *)(uVar16 + 0x54) + *(float *)(uVar16 + 0x84) * fStack_1044;
            auVar37._8_4_ =
                 fStack_1020 * fStack_ff0 +
                 fStack_1030 * *(float *)(uVar16 + 0x58) + *(float *)(uVar16 + 0x88) * fStack_1040;
            auVar37._12_4_ =
                 fStack_101c * fStack_fec +
                 fStack_102c * *(float *)(uVar16 + 0x5c) + *(float *)(uVar16 + 0x8c) * fStack_103c;
            auVar48._0_4_ =
                 *(float *)(uVar16 + 0x30) * local_1028 +
                 local_1008 * local_1038 + *(float *)(uVar16 + 0x90) * local_1048;
            auVar48._4_4_ =
                 *(float *)(uVar16 + 0x34) * fStack_1024 +
                 fStack_1004 * fStack_1034 + *(float *)(uVar16 + 0x94) * fStack_1044;
            auVar48._8_4_ =
                 *(float *)(uVar16 + 0x38) * fStack_1020 +
                 fStack_1000 * fStack_1030 + *(float *)(uVar16 + 0x98) * fStack_1040;
            auVar48._12_4_ =
                 *(float *)(uVar16 + 0x3c) * fStack_101c +
                 fStack_ffc * fStack_102c + *(float *)(uVar16 + 0x9c) * fStack_103c;
            auVar94._0_4_ =
                 *(float *)(uVar16 + 0x40) * local_1028 +
                 local_1038 * local_fe8 + *(float *)(uVar16 + 0xa0) * local_1048;
            auVar94._4_4_ =
                 *(float *)(uVar16 + 0x44) * fStack_1024 +
                 fStack_1034 * fStack_fe4 + *(float *)(uVar16 + 0xa4) * fStack_1044;
            auVar94._8_4_ =
                 *(float *)(uVar16 + 0x48) * fStack_1020 +
                 fStack_1030 * fStack_fe0 + *(float *)(uVar16 + 0xa8) * fStack_1040;
            auVar94._12_4_ =
                 *(float *)(uVar16 + 0x4c) * fStack_101c +
                 fStack_102c * fStack_fdc + *(float *)(uVar16 + 0xac) * fStack_103c;
            auVar66._8_4_ = 0x7fffffff;
            auVar66._0_8_ = 0x7fffffff7fffffff;
            auVar66._12_4_ = 0x7fffffff;
            auVar26 = vandps_avx(auVar37,auVar66);
            auVar27._8_4_ = 0x219392ef;
            auVar27._0_8_ = 0x219392ef219392ef;
            auVar27._12_4_ = 0x219392ef;
            auVar26 = vcmpps_avx(auVar26,auVar27,1);
            auVar25 = vblendvps_avx(auVar37,auVar27,auVar26);
            auVar26 = vandps_avx(auVar48,auVar66);
            auVar26 = vcmpps_avx(auVar26,auVar27,1);
            auVar75 = vblendvps_avx(auVar48,auVar27,auVar26);
            auVar26 = vandps_avx(auVar94,auVar66);
            auVar26 = vcmpps_avx(auVar26,auVar27,1);
            auVar26 = vblendvps_avx(auVar94,auVar27,auVar26);
            auVar45 = vshufps_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),0);
            fVar44 = auVar45._0_4_;
            auVar99._0_4_ = fVar44 + fVar41 * *(float *)(uVar16 + 0x110);
            fVar34 = auVar45._4_4_;
            auVar99._4_4_ = fVar34 + fVar31 * *(float *)(uVar16 + 0x114);
            fVar24 = auVar45._8_4_;
            auVar99._8_4_ = fVar24 + fVar52 * *(float *)(uVar16 + 0x118);
            fVar51 = auVar45._12_4_;
            auVar99._12_4_ = fVar51 + fVar42 * *(float *)(uVar16 + 0x11c);
            local_1018 = fVar44 + fVar41 * *(float *)(uVar16 + 0x120);
            fStack_1014 = fVar34 + fVar31 * *(float *)(uVar16 + 0x124);
            fStack_1010 = fVar24 + fVar52 * *(float *)(uVar16 + 0x128);
            fStack_100c = fVar51 + fVar42 * *(float *)(uVar16 + 300);
            auVar92._0_4_ = fVar41 * *(float *)(uVar16 + 0x130) + fVar44;
            auVar92._4_4_ = fVar31 * *(float *)(uVar16 + 0x134) + fVar34;
            auVar92._8_4_ = fVar52 * *(float *)(uVar16 + 0x138) + fVar24;
            auVar92._12_4_ = fVar42 * *(float *)(uVar16 + 0x13c) + fVar51;
            auVar45 = vrcpps_avx(auVar25);
            fVar44 = auVar45._0_4_;
            auVar38._0_4_ = auVar25._0_4_ * fVar44;
            fVar51 = auVar45._4_4_;
            auVar38._4_4_ = auVar25._4_4_ * fVar51;
            fVar52 = auVar45._8_4_;
            auVar38._8_4_ = auVar25._8_4_ * fVar52;
            fVar53 = auVar45._12_4_;
            auVar38._12_4_ = auVar25._12_4_ * fVar53;
            auVar60._8_4_ = 0x3f800000;
            auVar60._0_8_ = 0x3f8000003f800000;
            auVar60._12_4_ = 0x3f800000;
            auVar25 = vsubps_avx(auVar60,auVar38);
            fVar44 = fVar44 + fVar44 * auVar25._0_4_;
            fVar51 = fVar51 + fVar51 * auVar25._4_4_;
            fVar52 = fVar52 + fVar52 * auVar25._8_4_;
            fVar53 = fVar53 + fVar53 * auVar25._12_4_;
            auVar25 = vrcpps_avx(auVar75);
            fVar34 = auVar25._0_4_;
            auVar28._0_4_ = auVar75._0_4_ * fVar34;
            fVar41 = auVar25._4_4_;
            auVar28._4_4_ = auVar75._4_4_ * fVar41;
            fVar42 = auVar25._8_4_;
            auVar28._8_4_ = auVar75._8_4_ * fVar42;
            fVar43 = auVar25._12_4_;
            auVar28._12_4_ = auVar75._12_4_ * fVar43;
            auVar25 = vsubps_avx(auVar60,auVar28);
            fVar34 = fVar34 + fVar34 * auVar25._0_4_;
            fVar41 = fVar41 + fVar41 * auVar25._4_4_;
            fVar42 = fVar42 + fVar42 * auVar25._8_4_;
            fVar43 = fVar43 + fVar43 * auVar25._12_4_;
            auVar25 = vrcpps_avx(auVar26);
            fVar24 = auVar25._0_4_;
            auVar67._0_4_ = auVar26._0_4_ * fVar24;
            fVar31 = auVar25._4_4_;
            auVar67._4_4_ = auVar26._4_4_ * fVar31;
            fVar32 = auVar25._8_4_;
            auVar67._8_4_ = auVar26._8_4_ * fVar32;
            fVar33 = auVar25._12_4_;
            auVar67._12_4_ = auVar26._12_4_ * fVar33;
            auVar95 = ZEXT1664(local_1068);
            auVar26 = vsubps_avx(auVar60,auVar67);
            fVar24 = fVar24 + fVar24 * auVar26._0_4_;
            fVar31 = fVar31 + fVar31 * auVar26._4_4_;
            fVar32 = fVar32 + fVar32 * auVar26._8_4_;
            fVar33 = fVar33 + fVar33 * auVar26._12_4_;
            auVar86 = ZEXT1664(local_1058);
            fVar93 = local_1068._0_4_;
            fVar96 = local_1068._4_4_;
            fVar97 = local_1068._8_4_;
            fVar98 = local_1068._12_4_;
            fVar85 = local_1058._0_4_;
            fVar87 = local_1058._4_4_;
            fVar88 = local_1058._8_4_;
            fVar89 = local_1058._12_4_;
            auVar68._0_4_ =
                 fVar85 * local_ff8 +
                 fVar93 * *(float *)(uVar16 + 0x50) +
                 *(float *)(uVar16 + 0x80) * fVar54 + *(float *)(uVar16 + 0xb0);
            auVar68._4_4_ =
                 fVar87 * fStack_ff4 +
                 fVar96 * *(float *)(uVar16 + 0x54) +
                 *(float *)(uVar16 + 0x84) * fVar54 + *(float *)(uVar16 + 0xb4);
            auVar68._8_4_ =
                 fVar88 * fStack_ff0 +
                 fVar97 * *(float *)(uVar16 + 0x58) +
                 *(float *)(uVar16 + 0x88) * fVar54 + *(float *)(uVar16 + 0xb8);
            auVar68._12_4_ =
                 fVar89 * fStack_fec +
                 fVar98 * *(float *)(uVar16 + 0x5c) +
                 *(float *)(uVar16 + 0x8c) * fVar54 + *(float *)(uVar16 + 0xbc);
            auVar90 = ZEXT1664(local_1098);
            auVar73._0_4_ =
                 fVar85 * *(float *)(uVar16 + 0x30) +
                 fVar93 * local_1008 +
                 *(float *)(uVar16 + 0x90) * fVar54 + *(float *)(uVar16 + 0xc0);
            auVar73._4_4_ =
                 fVar87 * *(float *)(uVar16 + 0x34) +
                 fVar96 * fStack_1004 +
                 *(float *)(uVar16 + 0x94) * fVar54 + *(float *)(uVar16 + 0xc4);
            auVar73._8_4_ =
                 fVar88 * *(float *)(uVar16 + 0x38) +
                 fVar97 * fStack_1000 +
                 *(float *)(uVar16 + 0x98) * fVar54 + *(float *)(uVar16 + 200);
            auVar73._12_4_ =
                 fVar89 * *(float *)(uVar16 + 0x3c) +
                 fVar98 * fStack_ffc +
                 *(float *)(uVar16 + 0x9c) * fVar54 + *(float *)(uVar16 + 0xcc);
            auVar91 = ZEXT1664(local_10a8);
            auVar78._0_4_ =
                 fVar85 * *(float *)(uVar16 + 0x40) +
                 *(float *)(uVar16 + 0xa0) * fVar54 + *(float *)(uVar16 + 0xd0) + fVar93 * local_fe8
            ;
            auVar78._4_4_ =
                 fVar87 * *(float *)(uVar16 + 0x44) +
                 *(float *)(uVar16 + 0xa4) * fVar54 + *(float *)(uVar16 + 0xd4) +
                 fVar96 * fStack_fe4;
            auVar78._8_4_ =
                 fVar88 * *(float *)(uVar16 + 0x48) +
                 *(float *)(uVar16 + 0xa8) * fVar54 + *(float *)(uVar16 + 0xd8) +
                 fVar97 * fStack_fe0;
            auVar78._12_4_ =
                 fVar89 * *(float *)(uVar16 + 0x4c) +
                 *(float *)(uVar16 + 0xac) * fVar54 + *(float *)(uVar16 + 0xdc) +
                 fVar98 * fStack_fdc;
            auVar11._4_4_ = fStack_fd4;
            auVar11._0_4_ = local_fd8;
            auVar11._8_4_ = fStack_fd0;
            auVar11._12_4_ = fStack_fcc;
            auVar26 = vsubps_avx(auVar11,auVar68);
            auVar25 = vsubps_avx(auVar99,auVar68);
            auVar12._4_4_ = fStack_fc4;
            auVar12._0_4_ = local_fc8;
            auVar12._8_4_ = fStack_fc0;
            auVar12._12_4_ = fStack_fbc;
            auVar75 = vsubps_avx(auVar12,auVar73);
            auVar10._4_4_ = fStack_1014;
            auVar10._0_4_ = local_1018;
            auVar10._8_4_ = fStack_1010;
            auVar10._12_4_ = fStack_100c;
            auVar45 = vsubps_avx(auVar10,auVar73);
            auVar9._4_4_ = fStack_10d4;
            auVar9._0_4_ = local_10d8;
            auVar9._8_4_ = fStack_10d0;
            auVar9._12_4_ = fStack_10cc;
            auVar21 = vsubps_avx(auVar9,auVar78);
            auVar61 = vsubps_avx(auVar92,auVar78);
            auVar81._0_4_ = auVar26._0_4_ * fVar44;
            auVar81._4_4_ = auVar26._4_4_ * fVar51;
            auVar81._8_4_ = auVar26._8_4_ * fVar52;
            auVar81._12_4_ = auVar26._12_4_ * fVar53;
            auVar49._0_4_ = auVar25._0_4_ * fVar44;
            auVar49._4_4_ = auVar25._4_4_ * fVar51;
            auVar49._8_4_ = auVar25._8_4_ * fVar52;
            auVar49._12_4_ = auVar25._12_4_ * fVar53;
            auVar69._0_4_ = auVar75._0_4_ * fVar34;
            auVar69._4_4_ = auVar75._4_4_ * fVar41;
            auVar69._8_4_ = auVar75._8_4_ * fVar42;
            auVar69._12_4_ = auVar75._12_4_ * fVar43;
            auVar84 = ZEXT1664(local_1088);
            auVar74._0_4_ = auVar21._0_4_ * fVar24;
            auVar74._4_4_ = auVar21._4_4_ * fVar31;
            auVar74._8_4_ = auVar21._8_4_ * fVar32;
            auVar74._12_4_ = auVar21._12_4_ * fVar33;
            auVar39._0_4_ = auVar45._0_4_ * fVar34;
            auVar39._4_4_ = auVar45._4_4_ * fVar41;
            auVar39._8_4_ = auVar45._8_4_ * fVar42;
            auVar39._12_4_ = auVar45._12_4_ * fVar43;
            auVar29._0_4_ = auVar61._0_4_ * fVar24;
            auVar29._4_4_ = auVar61._4_4_ * fVar31;
            auVar29._8_4_ = auVar61._8_4_ * fVar32;
            auVar29._12_4_ = auVar61._12_4_ * fVar33;
            auVar26 = vpminsd_avx(auVar69,auVar39);
            auVar25 = vpminsd_avx(auVar74,auVar29);
            auVar26 = vmaxps_avx(auVar26,auVar25);
            auVar21 = vpminsd_avx(auVar81,auVar49);
            auVar45 = vpmaxsd_avx(auVar81,auVar49);
            auVar82 = ZEXT1664(local_1078);
            auVar25 = vpmaxsd_avx(auVar69,auVar39);
            auVar75 = vpmaxsd_avx(auVar74,auVar29);
            auVar75 = vminps_avx(auVar25,auVar75);
            auVar25 = vmaxps_avx(local_10a8,auVar21);
            local_10e8 = vmaxps_avx(auVar25,auVar26);
            auVar26 = vminps_avx(auVar23._0_16_,auVar45);
            auVar26 = vminps_avx(auVar26,auVar75);
            auVar26 = vcmpps_avx(local_10e8,auVar26,2);
            uVar14 = vmovmskps_avx(auVar26);
          }
          else {
            auVar45 = vshufps_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),0);
            pfVar2 = (float *)(uVar16 + 0x80 + uVar20);
            fVar44 = auVar45._0_4_;
            fVar34 = auVar45._4_4_;
            fVar24 = auVar45._8_4_;
            fVar51 = auVar45._12_4_;
            pfVar1 = (float *)(uVar16 + 0x20 + uVar20);
            auVar35._0_4_ = fVar44 * *pfVar2 + *pfVar1;
            auVar35._4_4_ = fVar34 * pfVar2[1] + pfVar1[1];
            auVar35._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
            auVar35._12_4_ = fVar51 * pfVar2[3] + pfVar1[3];
            auVar26 = vsubps_avx(auVar35,auVar86._0_16_);
            pfVar2 = (float *)(uVar16 + 0x80 + uVar19);
            auVar36._0_4_ = auVar82._0_4_ * auVar26._0_4_;
            auVar36._4_4_ = auVar82._4_4_ * auVar26._4_4_;
            auVar36._8_4_ = auVar82._8_4_ * auVar26._8_4_;
            auVar36._12_4_ = auVar82._12_4_ * auVar26._12_4_;
            pfVar1 = (float *)(uVar16 + 0x20 + uVar19);
            auVar46._0_4_ = fVar44 * *pfVar2 + *pfVar1;
            auVar46._4_4_ = fVar34 * pfVar2[1] + pfVar1[1];
            auVar46._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
            auVar46._12_4_ = fVar51 * pfVar2[3] + pfVar1[3];
            auVar26 = vsubps_avx(auVar46,auVar95._0_16_);
            pfVar2 = (float *)(uVar16 + 0x80 + uVar18);
            pfVar1 = (float *)(uVar16 + 0x20 + uVar18);
            auVar56._0_4_ = fVar44 * *pfVar2 + *pfVar1;
            auVar56._4_4_ = fVar34 * pfVar2[1] + pfVar1[1];
            auVar56._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
            auVar56._12_4_ = fVar51 * pfVar2[3] + pfVar1[3];
            auVar47._0_4_ = auVar84._0_4_ * auVar26._0_4_;
            auVar47._4_4_ = auVar84._4_4_ * auVar26._4_4_;
            auVar47._8_4_ = auVar84._8_4_ * auVar26._8_4_;
            auVar47._12_4_ = auVar84._12_4_ * auVar26._12_4_;
            auVar26 = vsubps_avx(auVar56,auVar77);
            auVar57._0_4_ = auVar90._0_4_ * auVar26._0_4_;
            auVar57._4_4_ = auVar90._4_4_ * auVar26._4_4_;
            auVar57._8_4_ = auVar90._8_4_ * auVar26._8_4_;
            auVar57._12_4_ = auVar90._12_4_ * auVar26._12_4_;
            auVar26 = vmaxps_avx(auVar47,auVar57);
            pfVar2 = (float *)(uVar16 + 0x80 + (uVar20 ^ 0x10));
            pfVar1 = (float *)(uVar16 + 0x20 + (uVar20 ^ 0x10));
            auVar58._0_4_ = fVar44 * *pfVar2 + *pfVar1;
            auVar58._4_4_ = fVar34 * pfVar2[1] + pfVar1[1];
            auVar58._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
            auVar58._12_4_ = fVar51 * pfVar2[3] + pfVar1[3];
            auVar25 = vsubps_avx(auVar58,auVar86._0_16_);
            auVar59._0_4_ = auVar82._0_4_ * auVar25._0_4_;
            auVar59._4_4_ = auVar82._4_4_ * auVar25._4_4_;
            auVar59._8_4_ = auVar82._8_4_ * auVar25._8_4_;
            auVar59._12_4_ = auVar82._12_4_ * auVar25._12_4_;
            pfVar2 = (float *)(uVar16 + 0x80 + (uVar19 ^ 0x10));
            pfVar1 = (float *)(uVar16 + 0x20 + (uVar19 ^ 0x10));
            auVar64._0_4_ = fVar44 * *pfVar2 + *pfVar1;
            auVar64._4_4_ = fVar34 * pfVar2[1] + pfVar1[1];
            auVar64._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
            auVar64._12_4_ = fVar51 * pfVar2[3] + pfVar1[3];
            auVar25 = vsubps_avx(auVar64,auVar95._0_16_);
            auVar65._0_4_ = auVar84._0_4_ * auVar25._0_4_;
            auVar65._4_4_ = auVar84._4_4_ * auVar25._4_4_;
            auVar65._8_4_ = auVar84._8_4_ * auVar25._8_4_;
            auVar65._12_4_ = auVar84._12_4_ * auVar25._12_4_;
            pfVar2 = (float *)(uVar16 + 0x80 + (uVar18 ^ 0x10));
            pfVar1 = (float *)(uVar16 + 0x20 + (uVar18 ^ 0x10));
            auVar71._0_4_ = fVar44 * *pfVar2 + *pfVar1;
            auVar71._4_4_ = fVar34 * pfVar2[1] + pfVar1[1];
            auVar71._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
            auVar71._12_4_ = fVar51 * pfVar2[3] + pfVar1[3];
            auVar25 = vsubps_avx(auVar71,auVar77);
            auVar72._0_4_ = auVar90._0_4_ * auVar25._0_4_;
            auVar72._4_4_ = auVar90._4_4_ * auVar25._4_4_;
            auVar72._8_4_ = auVar90._8_4_ * auVar25._8_4_;
            auVar72._12_4_ = auVar90._12_4_ * auVar25._12_4_;
            auVar75 = vminps_avx(auVar65,auVar72);
            auVar25 = vmaxps_avx(auVar91._0_16_,auVar36);
            local_10e8 = vmaxps_avx(auVar25,auVar26);
            auVar26 = vminps_avx(auVar23._0_16_,auVar59);
            auVar26 = vminps_avx(auVar26,auVar75);
            if (uVar14 == 6) {
              auVar25 = vcmpps_avx(local_10e8,auVar26,2);
              auVar26 = vcmpps_avx(*(undefined1 (*) [16])(uVar16 + 0xe0),auVar45,2);
              auVar75 = vcmpps_avx(auVar45,*(undefined1 (*) [16])(uVar16 + 0xf0),1);
              auVar26 = vandps_avx(auVar26,auVar75);
              auVar26 = vandps_avx(auVar26,auVar25);
            }
            else {
              auVar26 = vcmpps_avx(local_10e8,auVar26,2);
            }
            auVar26 = vpslld_avx(auVar26,0x1f);
            uVar14 = vmovmskps_avx(auVar26);
          }
          context = (RayQueryContext *)CONCAT44((int)((ulong)context >> 0x20),uVar14);
          if (context == (RayQueryContext *)0x0) goto LAB_00b60730;
          lVar8 = 0;
          if (context != (RayQueryContext *)0x0) {
            for (; ((ulong)context >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
            }
          }
          uVar15 = *(ulong *)(uVar16 + lVar8 * 8);
          uVar14 = uVar14 - 1 & uVar14;
          if (uVar14 != 0) {
            uVar5 = *(uint *)(local_10e8 + lVar8 * 4);
            lVar8 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
              }
            }
            uVar7 = *(ulong *)(uVar16 + lVar8 * 8);
            uVar6 = *(uint *)(local_10e8 + lVar8 * 4);
            uVar14 = uVar14 - 1 & uVar14;
            context = (RayQueryContext *)(ulong)uVar14;
            if (uVar14 == 0) {
              if (uVar5 < uVar6) {
                *(ulong *)*pauVar17 = uVar7;
                *(uint *)(*pauVar17 + 8) = uVar6;
                pauVar17 = pauVar17 + 1;
              }
              else {
                *(ulong *)*pauVar17 = uVar15;
                *(uint *)(*pauVar17 + 8) = uVar5;
                uVar15 = uVar7;
                pauVar17 = pauVar17 + 1;
              }
            }
            else {
              auVar30._8_8_ = 0;
              auVar30._0_8_ = uVar15;
              auVar26 = vpunpcklqdq_avx(auVar30,ZEXT416(uVar5));
              auVar40._8_8_ = 0;
              auVar40._0_8_ = uVar7;
              auVar25 = vpunpcklqdq_avx(auVar40,ZEXT416(uVar6));
              lVar8 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; (uVar14 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                }
              }
              auVar50._8_8_ = 0;
              auVar50._0_8_ = *(ulong *)(uVar16 + lVar8 * 8);
              auVar45 = vpunpcklqdq_avx(auVar50,ZEXT416(*(uint *)(local_10e8 + lVar8 * 4)));
              auVar75 = vpcmpgtd_avx(auVar25,auVar26);
              uVar14 = uVar14 - 1 & uVar14;
              if (uVar14 == 0) {
                auVar21 = vpshufd_avx(auVar75,0xaa);
                auVar75 = vblendvps_avx(auVar25,auVar26,auVar21);
                auVar26 = vblendvps_avx(auVar26,auVar25,auVar21);
                auVar25 = vpcmpgtd_avx(auVar45,auVar75);
                auVar21 = vpshufd_avx(auVar25,0xaa);
                auVar25 = vblendvps_avx(auVar45,auVar75,auVar21);
                auVar75 = vblendvps_avx(auVar75,auVar45,auVar21);
                auVar45 = vpcmpgtd_avx(auVar75,auVar26);
                auVar21 = vpshufd_avx(auVar45,0xaa);
                auVar45 = vblendvps_avx(auVar75,auVar26,auVar21);
                auVar26 = vblendvps_avx(auVar26,auVar75,auVar21);
                *pauVar17 = auVar26;
                pauVar17[1] = auVar45;
                uVar15 = auVar25._0_8_;
                pauVar17 = pauVar17 + 2;
              }
              else {
                lVar8 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                  }
                }
                auVar70._8_8_ = 0;
                auVar70._0_8_ = *(ulong *)(uVar16 + lVar8 * 8);
                auVar61 = vpunpcklqdq_avx(auVar70,ZEXT416(*(uint *)(local_10e8 + lVar8 * 4)));
                auVar21 = vpshufd_avx(auVar75,0xaa);
                auVar75 = vblendvps_avx(auVar25,auVar26,auVar21);
                auVar26 = vblendvps_avx(auVar26,auVar25,auVar21);
                auVar25 = vpcmpgtd_avx(auVar61,auVar45);
                auVar21 = vpshufd_avx(auVar25,0xaa);
                auVar25 = vblendvps_avx(auVar61,auVar45,auVar21);
                auVar45 = vblendvps_avx(auVar45,auVar61,auVar21);
                auVar21 = vpcmpgtd_avx(auVar45,auVar26);
                auVar61 = vpshufd_avx(auVar21,0xaa);
                auVar21 = vblendvps_avx(auVar45,auVar26,auVar61);
                auVar26 = vblendvps_avx(auVar26,auVar45,auVar61);
                auVar45 = vpcmpgtd_avx(auVar25,auVar75);
                auVar61 = vpshufd_avx(auVar45,0xaa);
                auVar45 = vblendvps_avx(auVar25,auVar75,auVar61);
                auVar25 = vblendvps_avx(auVar75,auVar25,auVar61);
                auVar75 = vpcmpgtd_avx(auVar21,auVar25);
                auVar61 = vpshufd_avx(auVar75,0xaa);
                auVar75 = vblendvps_avx(auVar21,auVar25,auVar61);
                auVar25 = vblendvps_avx(auVar25,auVar21,auVar61);
                *pauVar17 = auVar26;
                pauVar17[1] = auVar25;
                pauVar17[2] = auVar75;
                uVar15 = auVar45._0_8_;
                pauVar17 = pauVar17 + 3;
              }
            }
          }
        }
        local_10d8 = SUB84(pauVar17,0);
        fStack_10d4 = (float)((ulong)pauVar17 >> 0x20);
        (**(code **)((long)local_10b8->leafIntersector +
                    (ulong)*(byte *)(uVar15 & 0xfffffffffffffff0) * 0x40))(local_fb8,ray,local_10b0)
        ;
        auVar91 = ZEXT1664(local_10a8);
        auVar90 = ZEXT1664(local_1098);
        auVar84 = ZEXT1664(local_1088);
        auVar82 = ZEXT1664(local_1078);
        auVar95 = ZEXT1664(local_1068);
        pauVar17 = (undefined1 (*) [16])CONCAT44(fStack_10d4,local_10d8);
        auVar86 = ZEXT1664(local_1058);
        fVar44 = (local_10c0->super_RayK<1>).tfar;
        auVar23 = ZEXT1664(CONCAT412(fVar44,CONCAT48(fVar44,CONCAT44(fVar44,fVar44))));
        context = extraout_RDX;
        ray = local_10c0;
      }
      goto LAB_00b60730;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }